

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfConvert.cpp
# Opt level: O3

uint Imf_3_4::halfToUint(half h)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((-1 < (short)h._h) && ((~h._h & 0x7c00) != 0 || (h._h & 0x3ff) == 0)) {
    uVar1 = 0xffffffff;
    if (h._h != 0x7c00) {
      uVar1 = (uint)(long)*(float *)(_imath_half_to_float_table + (ulong)(uint)h._h * 4);
    }
  }
  return uVar1;
}

Assistant:

unsigned int
halfToUint (half h)
{
    if (h.isNegative () || h.isNan ()) return 0;

    if (h.isInfinity ()) return std::numeric_limits<unsigned int>::max ();

    return static_cast<unsigned int> (h);
}